

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

void gen_assign(_node_t *node)

{
  sym_t *psVar1;
  char *pcVar2;
  
  fwrite("; assign { \n",0xc,1,(FILE *)f);
  gen_expr(node->children[1]);
  pcVar2 = (*node->children)->identifier;
  psVar1 = get_sym(pcVar2);
  fprintf((FILE *)f,"        ld      de, %s\n",pcVar2);
  if (psVar1->type_id == 0x80) {
    pcVar2 = "        ld      [de], a\n";
  }
  else {
    fwrite("        ld      [de], l\n",0x18,1,(FILE *)f);
    fwrite("        inc     de\n",0x13,1,(FILE *)f);
    pcVar2 = "        ld      [de], h\n";
  }
  fwrite(pcVar2,0x18,1,(FILE *)f);
  fwrite("; } assign \n",0xc,1,(FILE *)f);
  return;
}

Assistant:

void gen_assign(_node_t* node)
{
    sym_t* s;
    TODO("assign word");
    fprintf(f, "; assign { \n");
    gen_expr(node->children[RIGHTOP]);  /* Load byte into A or word into HL */

    s = gen_lvalue(node->children[LEFTOP]); /* Load ptr into DE */
    if (s->type_id == BYTE)
    {
        fprintf(f, "        ld      [de], a\n");
    }
    else
    {
        fprintf(f, "        ld      [de], l\n");
        fprintf(f, "        inc     de\n");
        fprintf(f, "        ld      [de], h\n");
    }

    fprintf(f, "; } assign \n");
}